

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

bool ON_Locale::ParseName
               (wchar_t *locale_name,int locale_name_element_count,wchar_t *language_code,
               size_t language_code_capacity,wchar_t *extlang_code,size_t extlang_code_capacity,
               wchar_t *script_code,size_t script_code_capacity,wchar_t *region_code,
               size_t region_code_capacity,wchar_t *sortorder,size_t sortorder_capacity)

{
  wchar_t wVar1;
  wchar_t *wASCII;
  char *locale_name_00;
  wchar_t *sASCII_length;
  wchar_t *wASCII_00;
  wchar_t *wASCII_01;
  ulong uVar2;
  ulong array_capacity;
  size_t wASCII_capacity;
  wchar_t *sASCII_length_00;
  wchar_t *sASCII_length_01;
  wchar_t *sASCII_length_02;
  wchar_t *wASCII_02;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ON_String buffer;
  char ssortorder [64];
  char sregion_code [64];
  char sscript_code [64];
  char slanguage_code [64];
  char local_78 [72];
  
  bVar3 = language_code_capacity != 0;
  wASCII = (wchar_t *)0x0;
  sASCII_length = (wchar_t *)0x0;
  if (language_code != (wchar_t *)0x0 && bVar3) {
    memset(language_code,0,language_code_capacity * 4);
    wASCII = (wchar_t *)language_code_capacity;
    sASCII_length = language_code;
  }
  bVar4 = extlang_code_capacity != 0;
  if (extlang_code != (wchar_t *)0x0 && bVar4) {
    memset(extlang_code,0,extlang_code_capacity << 2);
  }
  bVar5 = script_code_capacity != 0;
  wASCII_00 = (wchar_t *)0x0;
  sASCII_length_00 = (wchar_t *)0x0;
  if (script_code != (wchar_t *)0x0 && bVar5) {
    memset(script_code,0,script_code_capacity * 4);
    wASCII_00 = (wchar_t *)script_code_capacity;
    sASCII_length_00 = script_code;
  }
  bVar6 = region_code_capacity != 0;
  wASCII_01 = (wchar_t *)0x0;
  sASCII_length_02 = (wchar_t *)0x0;
  if (region_code != (wchar_t *)0x0 && bVar6) {
    memset(region_code,0,region_code_capacity * 4);
    wASCII_01 = (wchar_t *)region_code_capacity;
    sASCII_length_02 = region_code;
  }
  bVar7 = sortorder_capacity != 0;
  sASCII_length_01 = (wchar_t *)0x0;
  wASCII_02 = (wchar_t *)0x0;
  if (sortorder != (wchar_t *)0x0 && bVar7) {
    memset(sortorder,0,sortorder_capacity * 4);
    sASCII_length_01 = sortorder;
    wASCII_02 = (wchar_t *)sortorder_capacity;
  }
  if (((((language_code != (wchar_t *)0x0 && bVar3 || !bVar3) &&
        (extlang_code != (wchar_t *)0x0 && bVar4 || !bVar4)) &&
       (script_code != (wchar_t *)0x0 && bVar5 || !bVar5)) &&
      (region_code != (wchar_t *)0x0 && bVar6 || !bVar6)) &&
      (sortorder != (wchar_t *)0x0 && bVar7 || !bVar7)) {
    if (locale_name_element_count < 0) {
      locale_name_element_count = ON_wString::Length(locale_name);
    }
    if (locale_name_element_count == 0) {
      return true;
    }
    if (locale_name != (wchar_t *)0x0) {
      array_capacity = (ulong)(uint)locale_name_element_count;
      if (locale_name_element_count < 2) {
        return false;
      }
      if (*locale_name == L'\0') {
        return false;
      }
      ON_String::ON_String(&buffer);
      ON_String::ReserveArray(&buffer,array_capacity);
      ON_String::SetLength(&buffer,array_capacity);
      locale_name_00 = ON_String::Array(&buffer);
      uVar2 = 0;
      do {
        if (array_capacity == uVar2) {
LAB_004e777c:
          locale_name_00[array_capacity] = '\0';
          slanguage_code[0x30] = '\0';
          slanguage_code[0x31] = '\0';
          slanguage_code[0x32] = '\0';
          slanguage_code[0x33] = '\0';
          slanguage_code[0x34] = '\0';
          slanguage_code[0x35] = '\0';
          slanguage_code[0x36] = '\0';
          slanguage_code[0x37] = '\0';
          slanguage_code[0x38] = '\0';
          slanguage_code[0x39] = '\0';
          slanguage_code[0x3a] = '\0';
          slanguage_code[0x3b] = '\0';
          slanguage_code[0x3c] = '\0';
          slanguage_code[0x3d] = '\0';
          slanguage_code[0x3e] = '\0';
          slanguage_code[0x3f] = '\0';
          slanguage_code[0x20] = '\0';
          slanguage_code[0x21] = '\0';
          slanguage_code[0x22] = '\0';
          slanguage_code[0x23] = '\0';
          slanguage_code[0x24] = '\0';
          slanguage_code[0x25] = '\0';
          slanguage_code[0x26] = '\0';
          slanguage_code[0x27] = '\0';
          slanguage_code[0x28] = '\0';
          slanguage_code[0x29] = '\0';
          slanguage_code[0x2a] = '\0';
          slanguage_code[0x2b] = '\0';
          slanguage_code[0x2c] = '\0';
          slanguage_code[0x2d] = '\0';
          slanguage_code[0x2e] = '\0';
          slanguage_code[0x2f] = '\0';
          slanguage_code[0x10] = '\0';
          slanguage_code[0x11] = '\0';
          slanguage_code[0x12] = '\0';
          slanguage_code[0x13] = '\0';
          slanguage_code[0x14] = '\0';
          slanguage_code[0x15] = '\0';
          slanguage_code[0x16] = '\0';
          slanguage_code[0x17] = '\0';
          slanguage_code[0x18] = '\0';
          slanguage_code[0x19] = '\0';
          slanguage_code[0x1a] = '\0';
          slanguage_code[0x1b] = '\0';
          slanguage_code[0x1c] = '\0';
          slanguage_code[0x1d] = '\0';
          slanguage_code[0x1e] = '\0';
          slanguage_code[0x1f] = '\0';
          slanguage_code[0] = '\0';
          slanguage_code[1] = '\0';
          slanguage_code[2] = '\0';
          slanguage_code[3] = '\0';
          slanguage_code[4] = '\0';
          slanguage_code[5] = '\0';
          slanguage_code[6] = '\0';
          slanguage_code[7] = '\0';
          slanguage_code[8] = '\0';
          slanguage_code[9] = '\0';
          slanguage_code[10] = '\0';
          slanguage_code[0xb] = '\0';
          slanguage_code[0xc] = '\0';
          slanguage_code[0xd] = '\0';
          slanguage_code[0xe] = '\0';
          slanguage_code[0xf] = '\0';
          sscript_code[0x30] = '\0';
          sscript_code[0x31] = '\0';
          sscript_code[0x32] = '\0';
          sscript_code[0x33] = '\0';
          sscript_code[0x34] = '\0';
          sscript_code[0x35] = '\0';
          sscript_code[0x36] = '\0';
          sscript_code[0x37] = '\0';
          sscript_code[0x38] = '\0';
          sscript_code[0x39] = '\0';
          sscript_code[0x3a] = '\0';
          sscript_code[0x3b] = '\0';
          sscript_code[0x3c] = '\0';
          sscript_code[0x3d] = '\0';
          sscript_code[0x3e] = '\0';
          sscript_code[0x3f] = '\0';
          sscript_code[0x20] = '\0';
          sscript_code[0x21] = '\0';
          sscript_code[0x22] = '\0';
          sscript_code[0x23] = '\0';
          sscript_code[0x24] = '\0';
          sscript_code[0x25] = '\0';
          sscript_code[0x26] = '\0';
          sscript_code[0x27] = '\0';
          sscript_code[0x28] = '\0';
          sscript_code[0x29] = '\0';
          sscript_code[0x2a] = '\0';
          sscript_code[0x2b] = '\0';
          sscript_code[0x2c] = '\0';
          sscript_code[0x2d] = '\0';
          sscript_code[0x2e] = '\0';
          sscript_code[0x2f] = '\0';
          sscript_code[0x10] = '\0';
          sscript_code[0x11] = '\0';
          sscript_code[0x12] = '\0';
          sscript_code[0x13] = '\0';
          sscript_code[0x14] = '\0';
          sscript_code[0x15] = '\0';
          sscript_code[0x16] = '\0';
          sscript_code[0x17] = '\0';
          sscript_code[0x18] = '\0';
          sscript_code[0x19] = '\0';
          sscript_code[0x1a] = '\0';
          sscript_code[0x1b] = '\0';
          sscript_code[0x1c] = '\0';
          sscript_code[0x1d] = '\0';
          sscript_code[0x1e] = '\0';
          sscript_code[0x1f] = '\0';
          sscript_code[0] = '\0';
          sscript_code[1] = '\0';
          sscript_code[2] = '\0';
          sscript_code[3] = '\0';
          sscript_code[4] = '\0';
          sscript_code[5] = '\0';
          sscript_code[6] = '\0';
          sscript_code[7] = '\0';
          sscript_code[8] = '\0';
          sscript_code[9] = '\0';
          sscript_code[10] = '\0';
          sscript_code[0xb] = '\0';
          sscript_code[0xc] = '\0';
          sscript_code[0xd] = '\0';
          sscript_code[0xe] = '\0';
          sscript_code[0xf] = '\0';
          sregion_code[0x30] = '\0';
          sregion_code[0x31] = '\0';
          sregion_code[0x32] = '\0';
          sregion_code[0x33] = '\0';
          sregion_code[0x34] = '\0';
          sregion_code[0x35] = '\0';
          sregion_code[0x36] = '\0';
          sregion_code[0x37] = '\0';
          sregion_code[0x38] = '\0';
          sregion_code[0x39] = '\0';
          sregion_code[0x3a] = '\0';
          sregion_code[0x3b] = '\0';
          sregion_code[0x3c] = '\0';
          sregion_code[0x3d] = '\0';
          sregion_code[0x3e] = '\0';
          sregion_code[0x3f] = '\0';
          sregion_code[0x20] = '\0';
          sregion_code[0x21] = '\0';
          sregion_code[0x22] = '\0';
          sregion_code[0x23] = '\0';
          sregion_code[0x24] = '\0';
          sregion_code[0x25] = '\0';
          sregion_code[0x26] = '\0';
          sregion_code[0x27] = '\0';
          sregion_code[0x28] = '\0';
          sregion_code[0x29] = '\0';
          sregion_code[0x2a] = '\0';
          sregion_code[0x2b] = '\0';
          sregion_code[0x2c] = '\0';
          sregion_code[0x2d] = '\0';
          sregion_code[0x2e] = '\0';
          sregion_code[0x2f] = '\0';
          sregion_code[0x10] = '\0';
          sregion_code[0x11] = '\0';
          sregion_code[0x12] = '\0';
          sregion_code[0x13] = '\0';
          sregion_code[0x14] = '\0';
          sregion_code[0x15] = '\0';
          sregion_code[0x16] = '\0';
          sregion_code[0x17] = '\0';
          sregion_code[0x18] = '\0';
          sregion_code[0x19] = '\0';
          sregion_code[0x1a] = '\0';
          sregion_code[0x1b] = '\0';
          sregion_code[0x1c] = '\0';
          sregion_code[0x1d] = '\0';
          sregion_code[0x1e] = '\0';
          sregion_code[0x1f] = '\0';
          sregion_code[0] = '\0';
          sregion_code[1] = '\0';
          sregion_code[2] = '\0';
          sregion_code[3] = '\0';
          sregion_code[4] = '\0';
          sregion_code[5] = '\0';
          sregion_code[6] = '\0';
          sregion_code[7] = '\0';
          sregion_code[8] = '\0';
          sregion_code[9] = '\0';
          sregion_code[10] = '\0';
          sregion_code[0xb] = '\0';
          sregion_code[0xc] = '\0';
          sregion_code[0xd] = '\0';
          sregion_code[0xe] = '\0';
          sregion_code[0xf] = '\0';
          ssortorder[0x30] = '\0';
          ssortorder[0x31] = '\0';
          ssortorder[0x32] = '\0';
          ssortorder[0x33] = '\0';
          ssortorder[0x34] = '\0';
          ssortorder[0x35] = '\0';
          ssortorder[0x36] = '\0';
          ssortorder[0x37] = '\0';
          ssortorder[0x38] = '\0';
          ssortorder[0x39] = '\0';
          ssortorder[0x3a] = '\0';
          ssortorder[0x3b] = '\0';
          ssortorder[0x3c] = '\0';
          ssortorder[0x3d] = '\0';
          ssortorder[0x3e] = '\0';
          ssortorder[0x3f] = '\0';
          ssortorder[0x20] = '\0';
          ssortorder[0x21] = '\0';
          ssortorder[0x22] = '\0';
          ssortorder[0x23] = '\0';
          ssortorder[0x24] = '\0';
          ssortorder[0x25] = '\0';
          ssortorder[0x26] = '\0';
          ssortorder[0x27] = '\0';
          ssortorder[0x28] = '\0';
          ssortorder[0x29] = '\0';
          ssortorder[0x2a] = '\0';
          ssortorder[0x2b] = '\0';
          ssortorder[0x2c] = '\0';
          ssortorder[0x2d] = '\0';
          ssortorder[0x2e] = '\0';
          ssortorder[0x2f] = '\0';
          ssortorder[0x10] = '\0';
          ssortorder[0x11] = '\0';
          ssortorder[0x12] = '\0';
          ssortorder[0x13] = '\0';
          ssortorder[0x14] = '\0';
          ssortorder[0x15] = '\0';
          ssortorder[0x16] = '\0';
          ssortorder[0x17] = '\0';
          ssortorder[0x18] = '\0';
          ssortorder[0x19] = '\0';
          ssortorder[0x1a] = '\0';
          ssortorder[0x1b] = '\0';
          ssortorder[0x1c] = '\0';
          ssortorder[0x1d] = '\0';
          ssortorder[0x1e] = '\0';
          ssortorder[0x1f] = '\0';
          ssortorder[0] = '\0';
          ssortorder[1] = '\0';
          ssortorder[2] = '\0';
          ssortorder[3] = '\0';
          ssortorder[4] = '\0';
          ssortorder[5] = '\0';
          ssortorder[6] = '\0';
          ssortorder[7] = '\0';
          ssortorder[8] = '\0';
          ssortorder[9] = '\0';
          ssortorder[10] = '\0';
          ssortorder[0xb] = '\0';
          ssortorder[0xc] = '\0';
          ssortorder[0xd] = '\0';
          ssortorder[0xe] = '\0';
          ssortorder[0xf] = '\0';
          wASCII_capacity = 0x40;
          bVar3 = ParseName(locale_name_00,locale_name_element_count,slanguage_code,0x40,local_78,
                            0x40,sscript_code,0x40,sregion_code,0x40,ssortorder,0x40);
          if (bVar3) {
            bVar3 = ASCIICharToWide(slanguage_code,(size_t)sASCII_length,wASCII,wASCII_capacity);
            bVar4 = ASCIICharToWide(sscript_code,(size_t)sASCII_length_00,wASCII_00,wASCII_capacity)
            ;
            bVar5 = ASCIICharToWide(sregion_code,(size_t)sASCII_length_02,wASCII_01,wASCII_capacity)
            ;
            bVar6 = ASCIICharToWide(ssortorder,(size_t)sASCII_length_01,wASCII_02,wASCII_capacity);
            bVar3 = (bVar6 && bVar5) && (bVar4 && bVar3);
          }
          else {
LAB_004e787b:
            bVar3 = false;
          }
          ON_String::~ON_String(&buffer);
          return bVar3;
        }
        wVar1 = locale_name[uVar2];
        if (L'\x7f' < wVar1) goto LAB_004e787b;
        if (wVar1 == L'\0') {
          locale_name_element_count = (int)uVar2;
          array_capacity = uVar2;
          goto LAB_004e777c;
        }
        locale_name_00[uVar2] = (char)wVar1;
        uVar2 = uVar2 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool ON_Locale::ParseName(
  const wchar_t* locale_name,
  int locale_name_element_count,
  wchar_t* language_code,
  size_t language_code_capacity,
  wchar_t* extlang_code,
  size_t extlang_code_capacity,
  wchar_t* script_code,
  size_t script_code_capacity,
  wchar_t* region_code,
  size_t region_code_capacity,
  wchar_t* sortorder,
  size_t sortorder_capacity
  )
{
  bool rc = true;

  if (false == ZeroWideBuffer(language_code, language_code_capacity, sizeof(language_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(extlang_code, extlang_code_capacity, sizeof(extlang_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(script_code, script_code_capacity, sizeof(script_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(region_code, region_code_capacity, sizeof(region_code[0])))
    rc = false;
  if (false == ZeroWideBuffer(sortorder, sortorder_capacity, sizeof(sortorder[0])))
    rc = false;

  if (false == rc)
    return false;

  if ( locale_name_element_count < 0 )
    locale_name_element_count = ON_wString::Length(locale_name);

  if ( 0 == locale_name_element_count )
    return true;

  if ( nullptr == locale_name || 0 == locale_name[0] )
    return false;

  if ( locale_name_element_count < 2 )
    return false;

  ON_String buffer;
  buffer.ReserveArray(locale_name_element_count);
  buffer.SetLength(locale_name_element_count);
  char* sname = buffer.Array();
  for (int i = 0; i < locale_name_element_count; i++)
  {
    const wchar_t w = locale_name[i];
    if ( w > 127 )
      return false; // illegal symbol in language or locale name
    if (0 == w)
    {
      locale_name_element_count = i;
      break;
    }
    sname[i] = (char)w;
  }
  sname[locale_name_element_count] = 0;
  
  const size_t ON_S_CAPACITY = 64;
  char slanguage_code[ON_S_CAPACITY] = { 0 };
  char sextlang_code[ON_S_CAPACITY] = { 0 };
  char sscript_code[ON_S_CAPACITY] = { 0 };
  char sregion_code[ON_S_CAPACITY] = { 0 };
  char ssortorder[ON_S_CAPACITY] = { 0 };

  rc = ON_Locale::ParseName(
    sname,
    locale_name_element_count,
    slanguage_code, ON_S_CAPACITY,
    sextlang_code, ON_S_CAPACITY,
    sscript_code, ON_S_CAPACITY,
    sregion_code, ON_S_CAPACITY,
    ssortorder, ON_S_CAPACITY
    );

  if (!rc)
    return false;

  if ( !ASCIICharToWide(slanguage_code,ON_S_CAPACITY,language_code,language_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(sscript_code,ON_S_CAPACITY,script_code,script_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(sregion_code,ON_S_CAPACITY,region_code,region_code_capacity) )
    rc = false;
  if ( !ASCIICharToWide(ssortorder,ON_S_CAPACITY,sortorder,sortorder_capacity) )
    rc = false;

  return rc;
}